

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::BufferID>::emplace_back<slang::BufferID>
          (SmallVectorBase<slang::BufferID> *this,BufferID *args)

{
  size_type sVar1;
  pointer pBVar2;
  
  sVar1 = this->len;
  pBVar2 = this->data_ + sVar1;
  if (sVar1 == this->cap) {
    pBVar2 = emplaceRealloc<slang::BufferID>(this,pBVar2,args);
    return pBVar2;
  }
  this->data_[sVar1].id = args->id;
  this->len = sVar1 + 1;
  return pBVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }